

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFDebugFrame.h
# Opt level: O3

void __thiscall
llvm::dwarf::CIE::CIE
          (CIE *this,uint64_t Offset,uint64_t Length,uint8_t Version,SmallString<8U> *Augmentation,
          uint8_t AddressSize,uint8_t SegmentDescriptorSize,uint64_t CodeAlignmentFactor,
          int64_t DataAlignmentFactor,uint64_t ReturnAddressRegister,
          SmallString<8U> *AugmentationData,uint32_t FDEPointerEncoding,uint32_t LSDAPointerEncoding
          ,Optional<unsigned_long> Personality,Optional<unsigned_int> PersonalityEnc,ArchType Arch)

{
  (this->super_FrameEntry).Kind = FK_CIE;
  (this->super_FrameEntry).Offset = Offset;
  (this->super_FrameEntry).Length = Length;
  (this->super_FrameEntry).CFIs.Instructions.
  super__Vector_base<llvm::dwarf::CFIProgram::Instruction,_std::allocator<llvm::dwarf::CFIProgram::Instruction>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->super_FrameEntry).CFIs.Instructions.
  super__Vector_base<llvm::dwarf::CFIProgram::Instruction,_std::allocator<llvm::dwarf::CFIProgram::Instruction>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->super_FrameEntry).CFIs.Instructions.
  super__Vector_base<llvm::dwarf::CFIProgram::Instruction,_std::allocator<llvm::dwarf::CFIProgram::Instruction>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->super_FrameEntry).CFIs.CodeAlignmentFactor = CodeAlignmentFactor;
  (this->super_FrameEntry).CFIs.DataAlignmentFactor = DataAlignmentFactor;
  (this->super_FrameEntry).CFIs.Arch = Arch;
  (this->super_FrameEntry)._vptr_FrameEntry = (_func_int **)&PTR__CIE_01078458;
  this->Version = Version;
  SmallVector<char,_8U>::SmallVector
            (&(this->Augmentation).super_SmallVector<char,_8U>,
             &Augmentation->super_SmallVector<char,_8U>);
  this->AddressSize = AddressSize;
  this->SegmentDescriptorSize = SegmentDescriptorSize;
  this->CodeAlignmentFactor = CodeAlignmentFactor;
  this->DataAlignmentFactor = DataAlignmentFactor;
  this->ReturnAddressRegister = ReturnAddressRegister;
  SmallVector<char,_8U>::SmallVector
            (&(this->AugmentationData).super_SmallVector<char,_8U>,
             &AugmentationData->super_SmallVector<char,_8U>);
  this->FDEPointerEncoding = FDEPointerEncoding;
  this->LSDAPointerEncoding = LSDAPointerEncoding;
  (this->Personality).Storage.field_0 = Personality.Storage.field_0;
  (this->Personality).Storage.hasVal = Personality.Storage.hasVal;
  *(undefined7 *)&(this->Personality).Storage.field_0x9 = Personality.Storage._9_7_;
  (this->PersonalityEnc).Storage = PersonalityEnc.Storage;
  return;
}

Assistant:

CIE(uint64_t Offset, uint64_t Length, uint8_t Version,
      SmallString<8> Augmentation, uint8_t AddressSize,
      uint8_t SegmentDescriptorSize, uint64_t CodeAlignmentFactor,
      int64_t DataAlignmentFactor, uint64_t ReturnAddressRegister,
      SmallString<8> AugmentationData, uint32_t FDEPointerEncoding,
      uint32_t LSDAPointerEncoding, Optional<uint64_t> Personality,
      Optional<uint32_t> PersonalityEnc, Triple::ArchType Arch)
      : FrameEntry(FK_CIE, Offset, Length, CodeAlignmentFactor,
                   DataAlignmentFactor, Arch),
        Version(Version), Augmentation(std::move(Augmentation)),
        AddressSize(AddressSize), SegmentDescriptorSize(SegmentDescriptorSize),
        CodeAlignmentFactor(CodeAlignmentFactor),
        DataAlignmentFactor(DataAlignmentFactor),
        ReturnAddressRegister(ReturnAddressRegister),
        AugmentationData(std::move(AugmentationData)),
        FDEPointerEncoding(FDEPointerEncoding),
        LSDAPointerEncoding(LSDAPointerEncoding), Personality(Personality),
        PersonalityEnc(PersonalityEnc) {}